

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall
Units_checkScalingFactorOneUnitImported_Test::TestBody
          (Units_checkScalingFactorOneUnitImported_Test *this)

{
  string *psVar1;
  char cVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  UnitsPtr u1;
  UnitsPtr u2;
  ImportSourcePtr import;
  long *local_78;
  long *local_70;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  long local_60 [2];
  double local_50;
  string *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  string *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  string *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Units::create();
  psVar1 = local_48;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"u1","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  psVar1 = local_48;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  libcellml::Units::addUnit((StandardUnit)psVar1,0x16,1.0,1.0,(string *)0x0);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_38;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"u2","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  pcVar3 = "";
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"","");
  libcellml::Units::addUnit((StandardUnit)local_38,0x16,1.0,1.0,(string *)0x0);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  libcellml::ImportSource::create();
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"I_am_a_url","");
  libcellml::ImportSource::setUrl(local_28);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(local_48 + 0x10));
  local_78 = (long *)0x0;
  local_50 = (double)libcellml::Units::scalingFactor
                               ((shared_ptr *)&local_48,(shared_ptr *)&local_38,true);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_70,"0.0","libcellml::Units::scalingFactor(u1, u2)",
             (double *)&local_78,&local_50);
  if (local_70._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_68.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((local_68.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x594,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if (local_78 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78 != (long *)0x0)) {
        (**(code **)(*local_78 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78 = (long *)0x0;
  local_50 = (double)libcellml::Units::scalingFactor
                               ((shared_ptr *)&local_38,(shared_ptr *)&local_48,true);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_70,"0.0","libcellml::Units::scalingFactor(u2, u1)",
             (double *)&local_78,&local_50);
  if (local_70._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_68.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x595,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if (local_78 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78 != (long *)0x0)) {
        (**(code **)(*local_78 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  return;
}

Assistant:

TEST(Units, checkScalingFactorOneUnitImported)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit(libcellml::Units::StandardUnit::RADIAN, 0, 1.0, 1.0);

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit(libcellml::Units::StandardUnit::RADIAN, 0, 1.0, 1.0);

    libcellml::ImportSourcePtr import = libcellml::ImportSource::create();
    import->setUrl("I_am_a_url");

    u1->setImportSource(import);

    // Scaling factor returns 0.0 because of imported units.
    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u1, u2));
    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u2, u1));
}